

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

string * __thiscall
Catch::clara::TextFlow::Column::iterator::operator*[abi_cxx11_
          (string *__return_storage_ptr__,iterator *this)

{
  ulong uVar1;
  size_type sVar2;
  string *psVar3;
  string local_38;
  iterator *local_18;
  iterator *this_local;
  
  uVar1 = this->m_stringIndex;
  local_18 = this;
  this_local = (iterator *)__return_storage_ptr__;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_column->m_strings);
  if (sVar2 <= uVar1) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/surge-synthesizer[P]tuning-library/libs/catch2/catch2.hpp"
                  ,0x217f,"std::string Catch::clara::TextFlow::Column::iterator::operator*() const")
    ;
  }
  if (this->m_pos <= this->m_end) {
    psVar3 = line_abi_cxx11_(this);
    ::std::__cxx11::string::substr((ulong)&local_38,(ulong)psVar3);
    addIndentAndSuffix(__return_storage_ptr__,this,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    return __return_storage_ptr__;
  }
  __assert_fail("m_pos <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/surge-synthesizer[P]tuning-library/libs/catch2/catch2.hpp"
                ,0x2180,"std::string Catch::clara::TextFlow::Column::iterator::operator*() const");
}

Assistant:

auto operator *() const -> std::string {
			assert(m_stringIndex < m_column.m_strings.size());
			assert(m_pos <= m_end);
			return addIndentAndSuffix(line().substr(m_pos, m_len));
		}